

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O3

void __thiscall
net_tests::ipv4_peer_with_ipv6_addrMe_test::test_method(ipv4_peer_with_ipv6_addrMe_test *this)

{
  long lVar1;
  mapped_type *pmVar2;
  __uniq_ptr_data<CNode,_std::default_delete<CNode>,_true,_true> this_00;
  iterator pvVar3;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  shared_ptr<Sock> sock;
  pair<std::_Rb_tree_iterator<std::pair<const_CNetAddr,_LocalServiceInfo>_>,_std::_Rb_tree_iterator<std::pair<const_CNetAddr,_LocalServiceInfo>_>_>
  pVar5;
  check_type cVar6;
  CNodeOptions *node_opts;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  unique_ptr<CNode,_std::default_delete<CNode>_> pnode;
  in_addr ipv4AddrPeer;
  in_addr raw_addr;
  UniqueLock<GlobalMutex> criticalblock31;
  _Storage<CService,_false> local_178;
  char local_150;
  direct_or_indirect local_148;
  uint local_138;
  undefined8 local_130;
  undefined2 local_128;
  direct_or_indirect local_120;
  shared_count asStack_110 [2];
  direct_or_indirect local_100;
  uint local_f0;
  undefined8 local_e8;
  undefined2 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  direct_or_indirect local_c8;
  uint local_b8;
  UniqueLock<GlobalMutex> criticalblock30;
  uint local_90;
  direct_or_indirect local_68;
  uint local_58;
  in6_addr ipv6AddrLocal;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  raw_addr.s_addr = 0x100007f;
  CNetAddr::CNetAddr((CNetAddr *)&local_68.indirect_contents,&raw_addr);
  criticalblock30.super_unique_lock._M_device = (mutex_type *)&g_maplocalhost_mutex;
  criticalblock30.super_unique_lock._M_owns = false;
  std::unique_lock<std::mutex>::lock(&criticalblock30.super_unique_lock);
  pmVar2 = std::
           map<CNetAddr,_LocalServiceInfo,_std::less<CNetAddr>,_std::allocator<std::pair<const_CNetAddr,_LocalServiceInfo>_>_>
           ::operator[](&mapLocalHost,(key_type *)&local_68.indirect_contents);
  pmVar2->nScore = 0x17;
  pmVar2->nPort = 0x2a;
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock30.super_unique_lock);
  ipv4AddrPeer.s_addr = 0xa0b0c001;
  CService::CService((CService *)&local_c8.indirect_contents,&ipv4AddrPeer,0x1e61);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&criticalblock30,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_c8.indirect_contents);
  if (0x10 < local_b8) {
    free(local_c8.indirect_contents.indirect);
    local_c8.indirect_contents.indirect = (char *)0x0;
  }
  CService::CService((CService *)&local_100.indirect_contents);
  local_d8 = 100000000;
  local_d0 = 0;
  local_120._8_8_ = 0;
  asStack_110[0].pi_ = asStack_110[0].pi_ & 0xffffffffffffff00;
  node_opts = (CNodeOptions *)0x4c038c;
  local_120.indirect_contents.indirect = (char *)asStack_110;
  this_00.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t.
  super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.super__Head_base<0UL,_CNode_*,_false>
  ._M_head_impl = (__uniq_ptr_impl<CNode,_std::default_delete<CNode>_>)operator_new(0x3a8);
  ipv6AddrLocal.__in6_u._0_8_ = 0;
  ipv6AddrLocal.__in6_u._8_8_ = 0;
  criticalblock31.super_unique_lock._M_device =
       (mutex_type *)((ulong)criticalblock31.super_unique_lock._M_device._4_4_ << 0x20);
  criticalblock31.super_unique_lock._M_owns = false;
  criticalblock31.super_unique_lock._9_7_ = 0;
  pvVar3 = (iterator)0x0;
  pvVar4 = (iterator)0x0;
  sock.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&criticalblock30;
  sock.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)&ipv6AddrLocal;
  CNode::CNode((CNode *)this_00.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t.
                        super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                        super__Head_base<0UL,_CNode_*,_false>._M_head_impl,0,sock,(CAddress *)0x0,0,
               (uint64_t)&local_100,(CAddress *)&local_120.indirect_contents,(string *)0x1,INBOUND,
               SUB81(&criticalblock31,0),node_opts);
  pnode._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t.
  super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.super__Head_base<0UL,_CNode_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<CNode,_std::default_delete<CNode>,_true,_true>)
       (__uniq_ptr_data<CNode,_std::default_delete<CNode>,_true,_true>)
       this_00.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t.
       super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
       super__Head_base<0UL,_CNode_*,_false>._M_head_impl;
  std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
            ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
             &criticalblock31.super_unique_lock._M_owns);
  if (ipv6AddrLocal.__in6_u._8_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ipv6AddrLocal.__in6_u._8_8_);
  }
  if ((shared_count *)local_120.indirect_contents.indirect != asStack_110) {
    operator_delete(local_120.indirect_contents.indirect,
                    (ulong)((long)&(asStack_110[0].pi_)->_vptr_sp_counted_base + 1));
  }
  if (0x10 < local_f0) {
    free(local_100.indirect_contents.indirect);
  }
  LOCK();
  *(undefined1 *)
   ((long)pnode._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>._M_t.
          super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
          super__Head_base<0UL,_CNode_*,_false>._M_head_impl + 0x219) = 1;
  UNLOCK();
  ipv6AddrLocal.__in6_u._8_8_ = 0;
  ipv6AddrLocal.__in6_u._0_8_ = 0xcc;
  CService::CService((CService *)&local_148.indirect_contents,&ipv6AddrLocal,0x1e61);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_100.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_148.indirect_contents);
  local_e8 = local_130;
  local_e0 = local_128;
  local_d8 = 100000000;
  local_d0 = 1;
  if (0x10 < local_138) {
    free(local_148.indirect_contents.indirect);
    local_148.indirect_contents.indirect = (char *)0x0;
  }
  CNode::SetAddrLocal((CNode *)pnode._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>.
                               _M_t.super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                               super__Head_base<0UL,_CNode_*,_false>._M_head_impl,
                      (CService *)&local_100.indirect_contents);
  GetLocalAddrForPeer((optional<CService> *)&local_178._M_value,
                      (CNode *)pnode._M_t.super___uniq_ptr_impl<CNode,_std::default_delete<CNode>_>.
                               _M_t.super__Tuple_impl<0UL,_CNode_*,_std::default_delete<CNode>_>.
                               super__Head_base<0UL,_CNode_*,_false>._M_head_impl);
  if ((local_150 == '\x01') &&
     (local_150 = '\0', 0x10 < local_178._M_value.super_CNetAddr.m_addr._size)) {
    free((void *)local_178._0_8_);
    local_178._0_8_ = (void *)0x0;
  }
  local_1c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar6 = 0x4c057b;
  file.m_end = (iterator)0x27d;
  file.m_begin = (iterator)&local_1c0;
  msg.m_end = pvVar4;
  msg.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1d0,msg);
  local_120.direct[0] = 1;
  local_120._8_8_ = 0;
  asStack_110[0].pi_ = (sp_counted_base *)0x0;
  local_1e0 = "1";
  local_1d8 = "";
  criticalblock31.super_unique_lock._8_8_ =
       criticalblock31.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock31.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01389048;
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_1e8 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_120.indirect_contents,(lazy_ostream *)&criticalblock31,1,0,
             WARN,_cVar6,(size_t)&local_1f0,0x27d);
  boost::detail::shared_count::~shared_count(asStack_110);
  criticalblock31.super_unique_lock._M_device = (mutex_type *)&g_maplocalhost_mutex;
  criticalblock31.super_unique_lock._8_8_ =
       criticalblock31.super_unique_lock._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::mutex>::lock(&criticalblock31.super_unique_lock);
  pVar5 = std::
          _Rb_tree<CNetAddr,_std::pair<const_CNetAddr,_LocalServiceInfo>,_std::_Select1st<std::pair<const_CNetAddr,_LocalServiceInfo>_>,_std::less<CNetAddr>,_std::allocator<std::pair<const_CNetAddr,_LocalServiceInfo>_>_>
          ::equal_range(&mapLocalHost._M_t,(key_type *)&local_68.indirect_contents);
  std::
  _Rb_tree<CNetAddr,_std::pair<const_CNetAddr,_LocalServiceInfo>,_std::_Select1st<std::pair<const_CNetAddr,_LocalServiceInfo>_>,_std::less<CNetAddr>,_std::allocator<std::pair<const_CNetAddr,_LocalServiceInfo>_>_>
  ::_M_erase_aux(&mapLocalHost._M_t,(_Base_ptr)pVar5.first._M_node,(_Base_ptr)pVar5.second._M_node);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock31.super_unique_lock);
  if (0x10 < local_f0) {
    free(local_100.indirect_contents.indirect);
  }
  std::unique_ptr<CNode,_std::default_delete<CNode>_>::~unique_ptr(&pnode);
  if (0x10 < local_90) {
    free(criticalblock30.super_unique_lock._M_device);
  }
  if (0x10 < local_58) {
    free(local_68.indirect_contents.indirect);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(ipv4_peer_with_ipv6_addrMe_test)
{
    // set up local addresses; all that's necessary to reproduce the bug is
    // that a normal IPv4 address is among the entries, but if this address is
    // !IsRoutable the undefined behavior is easier to trigger deterministically
    in_addr raw_addr;
    raw_addr.s_addr = htonl(0x7f000001);
    const CNetAddr mapLocalHost_entry = CNetAddr(raw_addr);
    {
        LOCK(g_maplocalhost_mutex);
        LocalServiceInfo lsi;
        lsi.nScore = 23;
        lsi.nPort = 42;
        mapLocalHost[mapLocalHost_entry] = lsi;
    }

    // create a peer with an IPv4 address
    in_addr ipv4AddrPeer;
    ipv4AddrPeer.s_addr = 0xa0b0c001;
    CAddress addr = CAddress(CService(ipv4AddrPeer, 7777), NODE_NETWORK);
    std::unique_ptr<CNode> pnode = std::make_unique<CNode>(/*id=*/0,
                                                           /*sock=*/nullptr,
                                                           addr,
                                                           /*nKeyedNetGroupIn=*/0,
                                                           /*nLocalHostNonceIn=*/0,
                                                           CAddress{},
                                                           /*pszDest=*/std::string{},
                                                           ConnectionType::OUTBOUND_FULL_RELAY,
                                                           /*inbound_onion=*/false);
    pnode->fSuccessfullyConnected.store(true);

    // the peer claims to be reaching us via IPv6
    in6_addr ipv6AddrLocal;
    memset(ipv6AddrLocal.s6_addr, 0, 16);
    ipv6AddrLocal.s6_addr[0] = 0xcc;
    CAddress addrLocal = CAddress(CService(ipv6AddrLocal, 7777), NODE_NETWORK);
    pnode->SetAddrLocal(addrLocal);

    // before patch, this causes undefined behavior detectable with clang's -fsanitize=memory
    GetLocalAddrForPeer(*pnode);

    // suppress no-checks-run warning; if this test fails, it's by triggering a sanitizer
    BOOST_CHECK(1);

    // Cleanup, so that we don't confuse other tests.
    {
        LOCK(g_maplocalhost_mutex);
        mapLocalHost.erase(mapLocalHost_entry);
    }
}